

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch_impl.h
# Opt level: O1

void __thiscall
SketchImpl<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>_>
::Deserialize(SketchImpl<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>_>
              *this,uchar *ptr)

{
  byte bVar1;
  long lVar2;
  pointer puVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint *val;
  pointer puVar7;
  uint val_1;
  uint uVar8;
  uint uVar9;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  puVar7 = (this->m_syndromes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->m_syndromes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar7 != puVar3) {
    iVar5 = 0;
    uVar8 = 0;
    do {
      iVar6 = iVar5;
      if (iVar5 < 0x19) {
        do {
          iVar5 = iVar6 + 8;
          bVar1 = *ptr;
          ptr = ptr + 1;
          uVar8 = uVar8 | (uint)bVar1 << ((byte)iVar6 & 0x1f);
          bVar4 = iVar6 < 0x11;
          iVar6 = iVar5;
        } while (bVar4);
      }
      uVar9 = 0;
      if (iVar5 < 0x20) {
        bVar1 = *ptr;
        uVar9 = (uint)(bVar1 >> (-(byte)iVar5 & 0x1f));
        ptr = ptr + 1;
        uVar8 = uVar8 | (uint)bVar1 << ((byte)iVar5 & 0x1f);
        iVar5 = iVar5 + -0x18;
      }
      else {
        iVar5 = 0;
      }
      *puVar7 = uVar8;
      puVar7 = puVar7 + 1;
      uVar8 = uVar9;
    } while (puVar7 != puVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Deserialize(const unsigned char* ptr) override
    {
        BitReader reader(ptr);
        for (auto& val : m_syndromes) {
            val = m_field.Deserialize(reader);
        }
    }